

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInExtensions(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  int i;
  long lVar3;
  
  lVar2 = 0;
  for (lVar3 = 0; pFVar1 = this->file_, lVar3 < *(int *)(pFVar1 + 0x38); lVar3 = lVar3 + 1) {
    FixForeignFieldsInExtension(this,(FieldDescriptor *)(*(long *)(pFVar1 + 0x80) + lVar2));
    lVar2 = lVar2 + 0x98;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(pFVar1 + 0x2c); lVar3 = lVar3 + 1) {
    FixForeignFieldsInNestedExtensions(this,(Descriptor *)(*(long *)(pFVar1 + 0x68) + lVar2));
    pFVar1 = this->file_;
    lVar2 = lVar2 + 0x90;
  }
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInExtensions() const {
  // Top-level extensions.
  for (int i = 0; i < file_->extension_count(); ++i) {
    FixForeignFieldsInExtension(*file_->extension(i));
  }
  // Nested extensions.
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInNestedExtensions(*file_->message_type(i));
  }
  printer_->Print("\n");
}